

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrbmp.c
# Opt level: O2

void write_os2_header(j_decompress_ptr cinfo,bmp_dest_ptr dest)

{
  J_COLOR_SPACE JVar1;
  uint uVar2;
  jpeg_error_mgr *pjVar3;
  bool bVar4;
  size_t sVar5;
  long lVar6;
  int map_colors;
  bool bVar7;
  undefined4 local_42;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined2 local_3a;
  byte local_38;
  undefined1 local_37;
  undefined2 local_36;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  undefined4 local_30;
  undefined1 local_2c;
  undefined1 local_2b;
  undefined2 local_2a;
  
  JVar1 = cinfo->out_color_space;
  bVar4 = false;
  if (JVar1 == JCS_RGB || JVar1 - JCS_EXT_RGB < 10) {
    bVar7 = cinfo->quantize_colors == 0;
    bVar4 = !bVar7;
    local_38 = bVar7 << 4 | 8;
    map_colors = (uint)bVar4 << 8;
  }
  else {
    local_38 = 0x18;
    if (JVar1 == JCS_CMYK) {
      map_colors = 0;
    }
    else {
      map_colors = 0;
      if (JVar1 != JCS_RGB565) {
        map_colors = 0x100;
        bVar4 = true;
        local_38 = 8;
      }
    }
  }
  uVar2 = cinfo->output_height;
  lVar6 = (ulong)dest->row_width * (ulong)uVar2 + (ulong)(uint)(map_colors * 3) + 0x1a;
  local_30 = 0;
  local_36 = 0x4d42;
  local_34 = (undefined1)lVar6;
  local_33 = (undefined1)((ulong)lVar6 >> 8);
  local_32 = (undefined1)((ulong)lVar6 >> 0x10);
  local_31 = (undefined1)((ulong)lVar6 >> 0x18);
  local_2c = 0x1a;
  local_2b = (undefined1)((uint)(map_colors * 3) >> 8);
  local_2a = 0;
  local_42 = 0xc;
  local_3e = (undefined1)cinfo->output_width;
  local_3d = (undefined1)(cinfo->output_width >> 8);
  local_3c = (undefined1)uVar2;
  local_3b = (undefined1)(uVar2 >> 8);
  local_3a = 1;
  local_37 = 0;
  sVar5 = fwrite(&local_36,1,0xe,(FILE *)(dest->pub).output_file);
  if (sVar5 != 0xe) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x25;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  sVar5 = fwrite(&local_42,1,0xc,(FILE *)(dest->pub).output_file);
  if (sVar5 != 0xc) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x25;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  if (bVar4) {
    write_colormap(cinfo,dest,map_colors,3);
    return;
  }
  return;
}

Assistant:

LOCAL(void)
write_os2_header(j_decompress_ptr cinfo, bmp_dest_ptr dest)
/* Write an OS2-style BMP file header, including colormap if needed */
{
  char bmpfileheader[14];
  char bmpcoreheader[12];
  long headersize, bfSize;
  int bits_per_pixel, cmap_entries;

  /* Compute colormap size and total file size */
  if (IsExtRGB(cinfo->out_color_space)) {
    if (cinfo->quantize_colors) {
      /* Colormapped RGB */
      bits_per_pixel = 8;
      cmap_entries = 256;
    } else {
      /* Unquantized, full color RGB */
      bits_per_pixel = 24;
      cmap_entries = 0;
    }
  } else if (cinfo->out_color_space == JCS_RGB565 ||
             cinfo->out_color_space == JCS_CMYK) {
    bits_per_pixel = 24;
    cmap_entries   = 0;
  } else {
    /* Grayscale output.  We need to fake a 256-entry colormap. */
    bits_per_pixel = 8;
    cmap_entries = 256;
  }
  /* File size */
  headersize = 14 + 12 + cmap_entries * 3; /* Header and colormap */
  bfSize = headersize + (long)dest->row_width * (long)cinfo->output_height;

  /* Set unused fields of header to 0 */
  MEMZERO(bmpfileheader, sizeof(bmpfileheader));
  MEMZERO(bmpcoreheader, sizeof(bmpcoreheader));

  /* Fill the file header */
  bmpfileheader[0] = 0x42;      /* first 2 bytes are ASCII 'B', 'M' */
  bmpfileheader[1] = 0x4D;
  PUT_4B(bmpfileheader, 2, bfSize); /* bfSize */
  /* we leave bfReserved1 & bfReserved2 = 0 */
  PUT_4B(bmpfileheader, 10, headersize); /* bfOffBits */

  /* Fill the info header (Microsoft calls this a BITMAPCOREHEADER) */
  PUT_2B(bmpcoreheader, 0, 12); /* bcSize */
  PUT_2B(bmpcoreheader, 4, cinfo->output_width); /* bcWidth */
  PUT_2B(bmpcoreheader, 6, cinfo->output_height); /* bcHeight */
  PUT_2B(bmpcoreheader, 8, 1);  /* bcPlanes - must be 1 */
  PUT_2B(bmpcoreheader, 10, bits_per_pixel); /* bcBitCount */

  if (JFWRITE(dest->pub.output_file, bmpfileheader, 14) != (size_t)14)
    ERREXIT(cinfo, JERR_FILE_WRITE);
  if (JFWRITE(dest->pub.output_file, bmpcoreheader, 12) != (size_t)12)
    ERREXIT(cinfo, JERR_FILE_WRITE);

  if (cmap_entries > 0)
    write_colormap(cinfo, dest, cmap_entries, 3);
}